

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall
el::base::TypedConfigurations::setValue<el::base::SubsecondPrecision>
          (TypedConfigurations *this,Level level,SubsecondPrecision *value,
          map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
          *confMap,bool includeGlobalLevel)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  Level local_2c;
  pair<el::Level,_el::base::SubsecondPrecision> local_28;
  
  local_2c = level;
  if ((confMap->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0 && includeGlobalLevel) {
    local_28.first = Global;
  }
  else {
    local_28.first = Global;
    iVar3 = utils::std::
            _Rb_tree<el::Level,_std::pair<const_el::Level,_el::base::SubsecondPrecision>,_std::_Select1st<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
            ::find(&confMap->_M_t,&local_28.first);
    p_Var1 = &(confMap->_M_t)._M_impl.super__Rb_tree_header;
    if (((_Rb_tree_header *)iVar3._M_node != p_Var1) &&
       (iVar6 = -(uint)((*value).m_width == (int)*(undefined8 *)&iVar3._M_node[1].field_0x4),
       iVar7 = -(uint)((*value).m_offset ==
                      (uint)((ulong)*(undefined8 *)&iVar3._M_node[1].field_0x4 >> 0x20)),
       auVar5._4_4_ = iVar6, auVar5._0_4_ = iVar6, auVar5._8_4_ = iVar7, auVar5._12_4_ = iVar7,
       iVar6 = movmskpd((int)iVar3._M_node,auVar5), iVar6 == 3)) {
      return;
    }
    iVar3 = utils::std::
            _Rb_tree<el::Level,_std::pair<const_el::Level,_el::base::SubsecondPrecision>,_std::_Select1st<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
            ::find(&confMap->_M_t,&local_2c);
    if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
      pmVar4 = utils::std::
               map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
               ::at(confMap,&local_2c);
      uVar2 = value->m_offset;
      pmVar4->m_width = value->m_width;
      pmVar4->m_offset = uVar2;
      return;
    }
    local_28.first = local_2c;
  }
  local_28.second.m_width = (*value).m_width;
  local_28.second.m_offset = (*value).m_offset;
  std::
  _Rb_tree<el::Level,std::pair<el::Level_const,el::base::SubsecondPrecision>,std::_Select1st<std::pair<el::Level_const,el::base::SubsecondPrecision>>,std::less<el::Level>,std::allocator<std::pair<el::Level_const,el::base::SubsecondPrecision>>>
  ::_M_emplace_unique<std::pair<el::Level,el::base::SubsecondPrecision>>
            ((_Rb_tree<el::Level,std::pair<el::Level_const,el::base::SubsecondPrecision>,std::_Select1st<std::pair<el::Level_const,el::base::SubsecondPrecision>>,std::less<el::Level>,std::allocator<std::pair<el::Level_const,el::base::SubsecondPrecision>>>
              *)confMap,&local_28);
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::map<Level, Conf_T>* confMap, bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }